

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

unsigned_long xmlSchemaValDecimalGetSignificantDigitCount(xmlSchemaValDecimal *decimal)

{
  int iVar1;
  uint local_24;
  uint local_20;
  uint integralPlaces;
  uint fractionalPlaces;
  xmlSchemaValDecimal *decimal_local;
  
  iVar1 = xmlSchemaValDecimalIsInteger(decimal);
  if (iVar1 == 0) {
    local_24 = decimal->fractionalPlaces;
  }
  else {
    local_24 = 0;
  }
  local_20 = decimal->integralPlaces;
  if ((local_20 == 1) && (decimal->str[1] == '0')) {
    local_20 = 0;
  }
  if (local_20 + local_24 == 0) {
    decimal_local = (xmlSchemaValDecimal *)0x1;
  }
  else {
    decimal_local = (xmlSchemaValDecimal *)(ulong)(local_20 + local_24);
  }
  return (unsigned_long)decimal_local;
}

Assistant:

static unsigned long
xmlSchemaValDecimalGetSignificantDigitCount(const xmlSchemaValDecimal *decimal)
{
	unsigned fractionalPlaces = xmlSchemaValDecimalIsInteger(decimal) ? 0 : decimal->fractionalPlaces;
	unsigned integralPlaces = decimal->integralPlaces;
	if(integralPlaces == 1 && decimal->str[1] == '0')
	{
		integralPlaces = 0;
	}
	if(integralPlaces+fractionalPlaces == 0)
	{
		/* 0, but that's still 1 significant digit */
		return 1;
	}
	return integralPlaces+fractionalPlaces;
}